

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::TransListCoverageBinInitializerSyntax::setChild
          (TransListCoverageBinInitializerSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  SeparatedSyntaxList<slang::syntax::TransSetSyntax> *pSVar3;
  logic_error *this_00;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 0) {
    ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>>
                       (*ppSVar2);
    (this->sets).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->sets).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->sets).super_SyntaxListBase.childCount = (pSVar3->super_SyntaxListBase).childCount;
    sVar1 = (pSVar3->elements).size_;
    (this->sets).elements.data_ = (pSVar3->elements).data_;
    (this->sets).elements.size_ = sVar1;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
             ,"");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
  local_d0._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar4[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x3251);
  std::operator+(&local_50,&local_d0,&local_70);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_b0 == plVar6) {
    local_a0 = *plVar6;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar6;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_f0 == plVar6) {
    local_e0 = *plVar6;
    lStack_d8 = plVar4[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar6;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void TransListCoverageBinInitializerSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: sets = child.node()->as<SeparatedSyntaxList<TransSetSyntax>>(); return;
        default: ASSUME_UNREACHABLE;
    }
}